

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr32.h
# Opt level: O3

int32_t __thiscall icu_63::UVector32::push(UVector32 *this,int32_t i,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  
  iVar2 = this->count;
  if ((iVar2 < -1) || (this->capacity <= iVar2)) {
    UVar1 = expandCapacity(this,iVar2 + 1,status);
    if (UVar1 == '\0') {
      return i;
    }
    iVar2 = this->count;
  }
  this->elements[iVar2] = i;
  this->count = this->count + 1;
  return i;
}

Assistant:

inline int32_t UVector32::push(int32_t i, UErrorCode &status) {
    addElement(i, status);
    return i;
}